

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_initializers.cpp
# Opt level: O2

void linker::set_uniform_initializer
               (void *mem_ctx,gl_shader_program *prog,char *name,glsl_type *type,ir_constant *val,
               uint boolean_true)

{
  glsl_base_type gVar1;
  glsl_type *pgVar2;
  int sh;
  glsl_type *pgVar3;
  char *pcVar4;
  ir_constant *val_00;
  gl_uniform_storage *pgVar5;
  byte bVar6;
  uint uVar7;
  uint i;
  ulong uVar8;
  uint elements;
  long lVar9;
  uint i_1;
  uint i_2;
  ulong uVar10;
  
  pgVar3 = glsl_type::without_array(type);
  if (type->field_0x4 == '\x0f') {
    lVar9 = 8;
    for (uVar8 = 0; uVar8 < type->length; uVar8 = uVar8 + 1) {
      pgVar3 = *(glsl_type **)((long)(type->fields).array + lVar9 + -8);
      pcVar4 = ralloc_asprintf(mem_ctx,"%s.%s",name,
                               *(undefined8 *)((long)&((type->fields).array)->gl_type + lVar9));
      val_00 = ir_constant::get_record_field(val,(int)uVar8);
      set_uniform_initializer(mem_ctx,prog,pcVar4,pgVar3,val_00,boolean_true);
      lVar9 = lVar9 + 0x30;
    }
  }
  else {
    if (pgVar3->field_0x4 == '\x0f') {
      pgVar3 = (type->fields).array;
    }
    else if ((type->field_0x4 != '\x11') ||
            (pgVar3 = (type->fields).array, pgVar3->field_0x4 != '\x11')) {
      pgVar5 = get_storage(prog,name);
      if (pgVar5 == (gl_uniform_storage *)0x0) {
        return;
      }
      pgVar3 = (val->super_ir_rvalue).type;
      if ((byte)pgVar3->field_0x4 == GLSL_TYPE_ARRAY) {
        pgVar2 = ((*val->const_elements)->super_ir_rvalue).type;
        gVar1 = *(glsl_base_type *)&pgVar2->field_0x4;
        uVar7 = gVar1 - GLSL_TYPE_DOUBLE;
        bVar6 = 0;
        if ((byte)uVar7 < 10) {
          bVar6 = (byte)*(undefined4 *)(&DAT_0021e8e4 + (ulong)(uVar7 & 0xff) * 4);
        }
        uVar7 = pgVar5->array_elements;
        if (uVar7 <= pgVar3->length) {
          elements = (uint)pgVar2->matrix_columns * (uint)pgVar2->vector_elements;
          uVar8 = 0;
          for (uVar10 = 0; uVar10 < uVar7; uVar10 = uVar10 + 1) {
            copy_constant_to_storage
                      (pgVar5->storage + uVar8,val->const_elements[uVar10],gVar1 & 0xff,elements,
                       boolean_true);
            uVar8 = (ulong)((int)uVar8 + (elements << (bVar6 & 0x1f)));
            uVar7 = pgVar5->array_elements;
          }
          return;
        }
        __assert_fail("val->type->length >= storage->array_elements",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_initializers.cpp"
                      ,0xe5,
                      "void linker::set_uniform_initializer(void *, gl_shader_program *, const char *, const glsl_type *, ir_constant *, unsigned int)"
                     );
      }
      copy_constant_to_storage
                (pgVar5->storage,val,(uint)(byte)pgVar3->field_0x4,
                 (uint)pgVar3->matrix_columns * (uint)pgVar3->vector_elements,boolean_true);
      if (pgVar5->type->field_0x4 != '\f') {
        return;
      }
      for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
        if ((prog->_LinkedShaders[lVar9] != (gl_linked_shader *)0x0) &&
           (pgVar5->opaque[lVar9].active == true)) {
          prog->_LinkedShaders[lVar9]->Program->SamplerUnits[pgVar5->opaque[lVar9].index] =
               *(GLubyte *)pgVar5->storage;
        }
      }
      return;
    }
    for (uVar8 = 0; uVar8 < type->length; uVar8 = uVar8 + 1) {
      pcVar4 = ralloc_asprintf(mem_ctx,"%s[%d]",name,uVar8 & 0xffffffff);
      set_uniform_initializer(mem_ctx,prog,pcVar4,pgVar3,val->const_elements[uVar8],boolean_true);
    }
  }
  return;
}

Assistant:

void
set_uniform_initializer(void *mem_ctx, gl_shader_program *prog,
                        const char *name, const glsl_type *type,
                        ir_constant *val, unsigned int boolean_true)
{
   const glsl_type *t_without_array = type->without_array();
   if (type->is_struct()) {
      for (unsigned int i = 0; i < type->length; i++) {
         const glsl_type *field_type = type->fields.structure[i].type;
         const char *field_name = ralloc_asprintf(mem_ctx, "%s.%s", name,
                                            type->fields.structure[i].name);
         set_uniform_initializer(mem_ctx, prog, field_name,
                                 field_type, val->get_record_field(i),
                                 boolean_true);
      }
      return;
   } else if (t_without_array->is_struct() ||
              (type->is_array() && type->fields.array->is_array())) {
      const glsl_type *const element_type = type->fields.array;

      for (unsigned int i = 0; i < type->length; i++) {
         const char *element_name = ralloc_asprintf(mem_ctx, "%s[%d]", name, i);

         set_uniform_initializer(mem_ctx, prog, element_name,
                                 element_type, val->const_elements[i],
                                 boolean_true);
      }
      return;
   }

   struct gl_uniform_storage *const storage = get_storage(prog, name);

   if (!storage)
      return;

   if (val->type->is_array()) {
      const enum glsl_base_type base_type =
         val->const_elements[0]->type->base_type;
      const unsigned int elements = val->const_elements[0]->type->components();
      unsigned int idx = 0;
      unsigned dmul = glsl_base_type_is_64bit(base_type) ? 2 : 1;

      assert(val->type->length >= storage->array_elements);
      for (unsigned int i = 0; i < storage->array_elements; i++) {
         copy_constant_to_storage(& storage->storage[idx],
                                  val->const_elements[i],
                                  base_type,
                                  elements,
                                  boolean_true);

         idx += elements * dmul;
      }
   } else {
      copy_constant_to_storage(storage->storage,
                               val,
                               val->type->base_type,
                               val->type->components(),
                               boolean_true);

      if (storage->type->is_sampler()) {
         for (int sh = 0; sh < MESA_SHADER_STAGES; sh++) {
            gl_linked_shader *shader = prog->_LinkedShaders[sh];

            if (shader && storage->opaque[sh].active) {
               unsigned index = storage->opaque[sh].index;

               shader->Program->SamplerUnits[index] = storage->storage[0].i;
            }
         }
      }
   }
}